

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O2

UBool ucnv_cleanup(void)

{
  int32_t iVar1;
  
  ucnv_flushCache_63();
  if (SHARED_DATA_HASHTABLE != (UHashtable *)0x0) {
    iVar1 = uhash_count_63(SHARED_DATA_HASHTABLE);
    if (iVar1 == 0) {
      uhash_close_63(SHARED_DATA_HASHTABLE);
      SHARED_DATA_HASHTABLE = (UHashtable *)0x0;
    }
  }
  gAvailableConverterCount = 0;
  if (gAvailableConverters != (char **)0x0) {
    uprv_free_63(gAvailableConverters);
    gAvailableConverters = (char **)0x0;
  }
  LOCK();
  gAvailableConvertersInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return SHARED_DATA_HASHTABLE == (UHashtable *)0x0;
}

Assistant:

static UBool U_CALLCONV ucnv_cleanup(void) {
    ucnv_flushCache();
    if (SHARED_DATA_HASHTABLE != NULL && uhash_count(SHARED_DATA_HASHTABLE) == 0) {
        uhash_close(SHARED_DATA_HASHTABLE);
        SHARED_DATA_HASHTABLE = NULL;
    }

    /* Isn't called from flushCache because other threads may have preexisting references to the table. */
    ucnv_flushAvailableConverterCache();

#if !U_CHARSET_IS_UTF8
    gDefaultConverterName = NULL;
    gDefaultConverterNameBuffer[0] = 0;
    gDefaultConverterContainsOption = FALSE;
    gDefaultAlgorithmicSharedData = NULL;
#endif

    return (SHARED_DATA_HASHTABLE == NULL);
}